

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O1

bool __thiscall Js::AsmJsModuleCompiler::Init(AsmJsModuleCompiler *this)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  AsmJsMathFunction *pAVar5;
  AsmJsMathFunction *this_00;
  AsmJsMathFunction *pAVar6;
  AsmJsMathFunction *pAVar7;
  AsmJsMathFunction *pAVar8;
  AsmJsMathFunction *pAVar9;
  AsmJsMathFunction *this_01;
  AsmJsMathFunction *pAVar10;
  AsmJsFunctionDeclaration *pAVar11;
  AsmJsTypedArrayFunction *this_02;
  ulong uVar12;
  AsmJsFunctionDeclaration **ppAVar13;
  undefined8 uStack_3b0;
  PropertyId local_3a8 [2];
  AsmJsTypedArrayFunction *local_3a0;
  undefined4 local_398 [2];
  AsmJsFunctionDeclaration *local_390;
  undefined4 local_388;
  AsmJsFunctionDeclaration *local_380;
  undefined4 local_378;
  AsmJsFunctionDeclaration *local_370;
  undefined4 local_368;
  AsmJsFunctionDeclaration *local_360;
  undefined4 local_358;
  AsmJsFunctionDeclaration *local_350;
  undefined4 local_348;
  AsmJsFunctionDeclaration *local_340;
  undefined4 local_338;
  AsmJsFunctionDeclaration *local_330;
  PropertyId aPStack_280 [2];
  undefined8 local_278;
  ConstMath constMath [10];
  undefined8 local_1d0 [38];
  AsmJsRetType local_a0;
  AsmJsRetType local_9c;
  AsmJsRetType local_98;
  AsmJsRetType local_94;
  AsmJsRetType local_90;
  AsmJsRetType local_8c;
  AsmJsRetType local_88;
  AsmJsRetType local_84;
  AsmJsRetType local_80;
  AsmJsRetType local_7c;
  AsmJsRetType local_78;
  AsmJsRetType local_74;
  AsmJsRetType local_70;
  AsmJsRetType local_6c;
  AsmJsRetType local_68;
  AsmJsRetType local_64;
  AsmJsRetType local_60;
  AsmJsRetType local_5c;
  AsmJsRetType local_58;
  AsmJsRetType local_54;
  AsmJsRetType local_50;
  AsmJsRetType local_4c;
  AsmJsRetType local_48;
  AsmJsRetType local_44;
  AsmJsRetType local_40;
  AsmJsRetType local_3c;
  AsmJsRetType local_38;
  AsmJsRetType local_34;
  
  if ((this->field_0x2e4 & 8) == 0) {
    this->field_0x2e4 = this->field_0x2e4 | 8;
    lVar4 = 8;
    do {
      *(undefined4 *)((long)&constMath[9].id + lVar4) = 0;
      *(undefined8 *)((long)&constMath[9].val + lVar4) = 0;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x138);
    uStack_3b0 = 0x95a894;
    pAVar5 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95a8ab;
    AsmJsRetType::AsmJsRetType(&local_a0,Double);
    uStack_3b0 = 4;
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_sin,Sin_Db,local_a0);
    constMath[9].val._0_4_ = 0x2f;
    uStack_3b0 = 0x95a8fd;
    pAVar5 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95a914;
    AsmJsRetType::AsmJsRetType(&local_9c,Double);
    uStack_3b0 = 4;
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_cos,Cos_Db,local_9c);
    uStack_3b0 = 0x95a963;
    pAVar5 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95a97a;
    AsmJsRetType::AsmJsRetType(&local_98,Double);
    uStack_3b0 = 4;
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_tan,Tan_Db,local_98);
    uStack_3b0 = 0x95a9c9;
    pAVar5 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95a9e0;
    AsmJsRetType::AsmJsRetType(&local_94,Double);
    uStack_3b0 = 4;
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_asin,Asin_Db,local_94);
    uStack_3b0 = 0x95aa2f;
    pAVar5 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95aa46;
    AsmJsRetType::AsmJsRetType(&local_90,Double);
    uStack_3b0 = 4;
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_acos,Acos_Db,local_90);
    uStack_3b0 = 0x95aa95;
    pAVar5 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95aaac;
    AsmJsRetType::AsmJsRetType(&local_8c,Double);
    uStack_3b0 = 4;
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_atan,Atan_Db,local_8c);
    uStack_3b0 = 0x95aafb;
    pAVar5 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95ab0f;
    AsmJsRetType::AsmJsRetType(&local_88,Double);
    uStack_3b0 = 4;
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_ceil,Ceil_Db,local_88);
    uStack_3b0 = 0x95ab5e;
    this_00 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95ab72;
    AsmJsRetType::AsmJsRetType(&local_84,Double);
    uStack_3b0 = 4;
    AsmJsMathFunction::AsmJsMathFunction
              (this_00,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_floor,Floor_Db,
               local_84);
    uStack_3b0 = 0x95abc1;
    pAVar6 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95abd5;
    AsmJsRetType::AsmJsRetType(&local_80,Double);
    uStack_3b0 = 4;
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar6,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_exp,Exp_Db,local_80);
    uStack_3b0 = 0x95ac24;
    pAVar6 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95ac38;
    AsmJsRetType::AsmJsRetType(&local_7c,Double);
    uStack_3b0 = 4;
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar6,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_log,Log_Db,local_7c);
    uStack_3b0 = 0x95ac87;
    pAVar6 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95ac9b;
    AsmJsRetType::AsmJsRetType(&local_78,Double);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar6,(PropertyName)0x0,&this->mAllocator,2,AsmJSMathBuiltin_pow,Pow_Db,local_78,4,4
              );
    uStack_3b0 = 0x95acf0;
    pAVar6 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95ad04;
    AsmJsRetType::AsmJsRetType(&local_74,Double);
    uStack_3b0 = 4;
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar6,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_sqrt,Sqrt_Db,local_74);
    uStack_3b0 = 0x95ad53;
    pAVar7 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95ad67;
    AsmJsRetType::AsmJsRetType(&local_70,Double);
    uStack_3b0 = 4;
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar7,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_abs,Abs_Db,local_70);
    uStack_3b0 = 0x95adb6;
    pAVar8 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95adca;
    AsmJsRetType::AsmJsRetType(&local_6c,Double);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar8,(PropertyName)0x0,&this->mAllocator,2,AsmJSMathBuiltin_atan2,Atan2_Db,local_6c
               ,4,4);
    uStack_3b0 = 0x95ae1f;
    pAVar8 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95ae33;
    AsmJsRetType::AsmJsRetType(&local_68,Signed);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar8,(PropertyName)0x0,&this->mAllocator,2,AsmJSMathBuiltin_imul,Imul_Int,local_68,
               0xc,0xc);
    uStack_3b0 = 0x95ae94;
    pAVar8 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95aea8;
    AsmJsRetType::AsmJsRetType(&local_64,Float);
    uStack_3b0 = 7;
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar8,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_fround,Fround_Flt,
               local_64);
    uStack_3b0 = 0x95aef7;
    pAVar9 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95af0b;
    AsmJsRetType::AsmJsRetType(&local_60,Double);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar9,(PropertyName)0x0,&this->mAllocator,2,AsmJSMathBuiltin_min,Min_Db,local_60,4,4
              );
    uStack_3b0 = 0x95af66;
    this_01 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95af7a;
    AsmJsRetType::AsmJsRetType(&local_5c,Double);
    AsmJsMathFunction::AsmJsMathFunction
              (this_01,(PropertyName)0x0,&this->mAllocator,2,AsmJSMathBuiltin_max,Max_Db,local_5c,4,
               4);
    uStack_3b0 = 0x95afd5;
    pAVar10 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95afe9;
    AsmJsRetType::AsmJsRetType(&local_58,Fixnum);
    uStack_3b0 = 0xc;
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar10,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_clz32,Clz32_Int,
               local_58);
    uStack_3b0 = 0x95b03f;
    pAVar10 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95b053;
    AsmJsRetType::AsmJsRetType(&local_54,Unsigned);
    uStack_3b0 = 10;
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar10,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_abs,Abs_Int,local_54);
    uStack_3b0 = 0x95b090;
    AsmJsMathFunction::SetOverload(pAVar7,pAVar10);
    uStack_3b0 = 0x95b0a9;
    pAVar10 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95b0bd;
    AsmJsRetType::AsmJsRetType(&local_50,Signed);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar10,(PropertyName)0x0,&this->mAllocator,2,AsmJSMathBuiltin_min,Min_Int,local_50,
               10,10);
    uStack_3b0 = 0x95b100;
    AsmJsMathFunction::SetOverload(pAVar9,pAVar10);
    uStack_3b0 = 0x95b119;
    pAVar9 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95b12d;
    AsmJsRetType::AsmJsRetType(&local_4c,Signed);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar9,(PropertyName)0x0,&this->mAllocator,2,AsmJSMathBuiltin_max,Max_Int,local_4c,10
               ,10);
    uStack_3b0 = 0x95b170;
    AsmJsMathFunction::SetOverload(this_01,pAVar9);
    uStack_3b0 = 0x95b189;
    pAVar9 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95b19d;
    AsmJsRetType::AsmJsRetType(&local_48,Float);
    uStack_3b0 = 4;
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar9,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_fround,Fround_Db,
               local_48);
    uStack_3b0 = 0x95b1da;
    AsmJsMathFunction::SetOverload(pAVar8,pAVar9);
    uStack_3b0 = 0x95b1f3;
    pAVar9 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95b207;
    AsmJsRetType::AsmJsRetType(&local_44,Float);
    uStack_3b0 = 0;
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar9,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_fround,Fround_Int,
               local_44);
    uStack_3b0 = 0x95b23e;
    AsmJsMathFunction::SetOverload(pAVar8,pAVar9);
    uStack_3b0 = 0x95b257;
    pAVar8 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95b26b;
    AsmJsRetType::AsmJsRetType(&local_40,Floatish);
    uStack_3b0 = 6;
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar8,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_abs,Abs_Flt,local_40);
    uStack_3b0 = 0x95b2a8;
    AsmJsMathFunction::SetOverload(pAVar7,pAVar8);
    uStack_3b0 = 0x95b2c1;
    pAVar7 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95b2d5;
    AsmJsRetType::AsmJsRetType(&local_3c,Floatish);
    uStack_3b0 = 6;
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar7,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_ceil,Ceil_Flt,local_3c)
    ;
    uStack_3b0 = 0x95b312;
    AsmJsMathFunction::SetOverload(pAVar5,pAVar7);
    uStack_3b0 = 0x95b32b;
    pAVar5 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95b33f;
    AsmJsRetType::AsmJsRetType(&local_38,Floatish);
    uStack_3b0 = 6;
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_floor,Floor_Flt,
               local_38);
    uStack_3b0 = 0x95b37c;
    AsmJsMathFunction::SetOverload(this_00,pAVar5);
    uStack_3b0 = 0x95b395;
    pAVar5 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95b3a9;
    AsmJsRetType::AsmJsRetType(&local_34,Floatish);
    uStack_3b0 = 6;
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_sqrt,Sqrt_Flt,local_34)
    ;
    uStack_3b0 = 0x95b3e0;
    AsmJsMathFunction::SetOverload(pAVar6,pAVar5);
    lVar4 = 8;
    do {
      pAVar5 = *(AsmJsMathFunction **)((long)&constMath[9].val + lVar4);
      uStack_3b0 = 0x95b401;
      bVar2 = AddStandardLibraryMathName
                        (this,*(PropertyId *)((long)&constMath[9].id + lVar4),pAVar5,
                         pAVar5->mBuiltIn);
      if (!bVar2) goto LAB_0095b86f;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x138);
    local_278 = 0x1400000075;
    constMath[0]._0_8_ = &Math::E;
    constMath[0].val = (double *)0x15000000d3;
    constMath[1]._0_8_ = &Math::LN10;
    constMath[1].val = (double *)0x16000000d4;
    constMath[2]._0_8_ = &Math::LN2;
    constMath[2].val = (double *)0x1700000029;
    constMath[3]._0_8_ = &Math::LOG2E;
    constMath[3].val = (double *)0x1800000028;
    constMath[4]._0_8_ = &Math::LOG10E;
    constMath[4].val = (double *)0x190000002b;
    constMath[5]._0_8_ = &Math::PI;
    constMath[5].val = (double *)0x1a00000157;
    constMath[6]._0_8_ = &Math::SQRT1_2;
    constMath[6].val = (double *)0x1b00000158;
    constMath[7]._0_8_ = &Math::SQRT2;
    constMath[7].val = (double *)0x1c000000ba;
    constMath[8]._0_8_ = &NumberConstants::POSITIVE_INFINITY;
    constMath[8].val = (double *)0x1d00000105;
    constMath[9]._0_8_ = &NumberConstants::NaN;
    lVar4 = 8;
    do {
      uStack_3b0 = 0x95b572;
      bVar2 = AddStandardLibraryMathName
                        (this,*(PropertyId *)((long)aPStack_280 + lVar4),
                         *(double **)((long)constMath + lVar4 + -8),
                         *(AsmJSMathBuiltinFunction *)((long)aPStack_280 + lVar4 + 4));
      if (!bVar2) goto LAB_0095b86f;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0xa8);
    lVar4 = 8;
    do {
      *(undefined4 *)((long)local_3a8 + lVar4 + -8) = 0;
      *(undefined8 *)((long)local_3a8 + lVar4) = 0;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x138);
    bVar2 = false;
    uStack_3b0 = 0x95b5cb;
    pAVar11 = (AsmJsFunctionDeclaration *)
              new<Memory::ArenaAllocator>(0x40,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95b5e0;
    AsmJsFunctionDeclaration::AsmJsFunctionDeclaration
              (pAVar11,(PropertyName)0x0,TypedArrayBuiltinFunction,&this->mAllocator);
    (pAVar11->super_AsmJsSymbol)._vptr_AsmJsSymbol = (_func_int **)&PTR_GetType_014fea90;
    *(undefined4 *)&pAVar11[1].super_AsmJsSymbol._vptr_AsmJsSymbol = 1;
    *(undefined1 *)((long)&pAVar11[1].super_AsmJsSymbol._vptr_AsmJsSymbol + 4) = 0;
    local_398[0] = 0x1ad;
    uStack_3b0 = 0x95b621;
    local_390 = pAVar11;
    this_02 = (AsmJsTypedArrayFunction *)
              new<Memory::ArenaAllocator>(0x40,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95b636;
    AsmJsFunctionDeclaration::AsmJsFunctionDeclaration
              ((AsmJsFunctionDeclaration *)this_02,(PropertyName)0x0,TypedArrayBuiltinFunction,
               &this->mAllocator);
    (this_02->super_AsmJsFunctionDeclaration).super_AsmJsSymbol._vptr_AsmJsSymbol =
         (_func_int **)&PTR_GetType_014fea90;
    this_02->mBuiltIn = AsmJSTypedArrayBuiltin_Uint8Array;
    this_02->mType = TYPE_UINT8;
    local_3a8[0] = 0x1b0;
    uStack_3b0 = 0x95b66c;
    local_3a0 = this_02;
    pAVar11 = (AsmJsFunctionDeclaration *)
              new<Memory::ArenaAllocator>(0x40,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95b681;
    AsmJsFunctionDeclaration::AsmJsFunctionDeclaration
              (pAVar11,(PropertyName)0x0,TypedArrayBuiltinFunction,&this->mAllocator);
    (pAVar11->super_AsmJsSymbol)._vptr_AsmJsSymbol = (_func_int **)&PTR_GetType_014fea90;
    *(undefined4 *)&pAVar11[1].super_AsmJsSymbol._vptr_AsmJsSymbol = 3;
    *(undefined1 *)((long)&pAVar11[1].super_AsmJsSymbol._vptr_AsmJsSymbol + 4) = 2;
    local_378 = 0x1ae;
    uStack_3b0 = 0x95b6b7;
    local_370 = pAVar11;
    pAVar11 = (AsmJsFunctionDeclaration *)
              new<Memory::ArenaAllocator>(0x40,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95b6cc;
    AsmJsFunctionDeclaration::AsmJsFunctionDeclaration
              (pAVar11,(PropertyName)0x0,TypedArrayBuiltinFunction,&this->mAllocator);
    (pAVar11->super_AsmJsSymbol)._vptr_AsmJsSymbol = (_func_int **)&PTR_GetType_014fea90;
    *(undefined4 *)&pAVar11[1].super_AsmJsSymbol._vptr_AsmJsSymbol = 2;
    *(undefined1 *)((long)&pAVar11[1].super_AsmJsSymbol._vptr_AsmJsSymbol + 4) = 3;
    local_388 = 0x1b2;
    uStack_3b0 = 0x95b702;
    local_380 = pAVar11;
    pAVar11 = (AsmJsFunctionDeclaration *)
              new<Memory::ArenaAllocator>(0x40,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95b717;
    AsmJsFunctionDeclaration::AsmJsFunctionDeclaration
              (pAVar11,(PropertyName)0x0,TypedArrayBuiltinFunction,&this->mAllocator);
    (pAVar11->super_AsmJsSymbol)._vptr_AsmJsSymbol = (_func_int **)&PTR_GetType_014fea90;
    *(undefined4 *)&pAVar11[1].super_AsmJsSymbol._vptr_AsmJsSymbol = 5;
    *(undefined1 *)((long)&pAVar11[1].super_AsmJsSymbol._vptr_AsmJsSymbol + 4) = 4;
    local_358 = 0x1af;
    uStack_3b0 = 0x95b74d;
    local_350 = pAVar11;
    pAVar11 = (AsmJsFunctionDeclaration *)
              new<Memory::ArenaAllocator>(0x40,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95b762;
    AsmJsFunctionDeclaration::AsmJsFunctionDeclaration
              (pAVar11,(PropertyName)0x0,TypedArrayBuiltinFunction,&this->mAllocator);
    (pAVar11->super_AsmJsSymbol)._vptr_AsmJsSymbol = (_func_int **)&PTR_GetType_014fea90;
    *(undefined4 *)&pAVar11[1].super_AsmJsSymbol._vptr_AsmJsSymbol = 4;
    *(undefined1 *)((long)&pAVar11[1].super_AsmJsSymbol._vptr_AsmJsSymbol + 4) = 5;
    local_368 = 0x1b3;
    uStack_3b0 = 0x95b798;
    local_360 = pAVar11;
    pAVar11 = (AsmJsFunctionDeclaration *)
              new<Memory::ArenaAllocator>(0x40,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95b7ad;
    AsmJsFunctionDeclaration::AsmJsFunctionDeclaration
              (pAVar11,(PropertyName)0x0,TypedArrayBuiltinFunction,&this->mAllocator);
    (pAVar11->super_AsmJsSymbol)._vptr_AsmJsSymbol = (_func_int **)&PTR_GetType_014fea90;
    *(undefined4 *)&pAVar11[1].super_AsmJsSymbol._vptr_AsmJsSymbol = 6;
    *(undefined1 *)((long)&pAVar11[1].super_AsmJsSymbol._vptr_AsmJsSymbol + 4) = 6;
    local_348 = 0x1b4;
    uStack_3b0 = 0x95b7e3;
    local_340 = pAVar11;
    pAVar11 = (AsmJsFunctionDeclaration *)
              new<Memory::ArenaAllocator>(0x40,&this->mAllocator,0x366bee);
    uStack_3b0 = 0x95b7f8;
    AsmJsFunctionDeclaration::AsmJsFunctionDeclaration
              (pAVar11,(PropertyName)0x0,TypedArrayBuiltinFunction,&this->mAllocator);
    (pAVar11->super_AsmJsSymbol)._vptr_AsmJsSymbol = (_func_int **)&PTR_GetType_014fea90;
    *(undefined4 *)&pAVar11[1].super_AsmJsSymbol._vptr_AsmJsSymbol = 7;
    *(undefined1 *)((long)&pAVar11[1].super_AsmJsSymbol._vptr_AsmJsSymbol + 4) = 7;
    local_338 = 0x1b5;
    uStack_3b0 = 0x95b831;
    local_330 = pAVar11;
    bVar3 = AddStandardLibraryArrayName(this,local_3a8[0],local_3a0,local_3a0->mBuiltIn);
    if (bVar3) {
      ppAVar13 = &local_390;
      uVar1 = 0;
      do {
        uVar12 = uVar1;
        if (uVar12 == 7) break;
        uStack_3b0 = 0x95b859;
        bVar2 = AddStandardLibraryArrayName
                          (this,*(PropertyId *)(ppAVar13 + -1),(AsmJsTypedArrayFunction *)*ppAVar13,
                           ((AsmJsTypedArrayFunction *)*ppAVar13)->mBuiltIn);
        ppAVar13 = ppAVar13 + 2;
        uVar1 = uVar12 + 1;
      } while (bVar2);
      bVar2 = 6 < uVar12;
    }
  }
  else {
LAB_0095b86f:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool AsmJsModuleCompiler::Init()
    {
        if (mInitialised)
        {
            return false;
        }
        mInitialised = true;

        struct MathFunc
        {
            MathFunc(PropertyId id_ = 0, AsmJsMathFunction* val_ = nullptr) :
                id(id_), val(val_)
            {
            }
            PropertyId id;
            AsmJsMathFunction* val;
        };
        MathFunc mathFunctions[AsmJSMathBuiltinFunction_COUNT];
        // we could move the mathBuiltinFuncname to MathFunc struct
        mathFunctions[AsmJSMathBuiltin_sin] = MathFunc(PropertyIds::sin, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_sin, OpCodeAsmJs::Sin_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_cos] = MathFunc(PropertyIds::cos, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_cos, OpCodeAsmJs::Cos_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_tan] = MathFunc(PropertyIds::tan, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_tan, OpCodeAsmJs::Tan_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_asin] = MathFunc(PropertyIds::asin, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_asin, OpCodeAsmJs::Asin_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_acos] = MathFunc(PropertyIds::acos, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_acos, OpCodeAsmJs::Acos_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_atan] = MathFunc(PropertyIds::atan, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_atan, OpCodeAsmJs::Atan_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_ceil] = MathFunc(PropertyIds::ceil, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_ceil, OpCodeAsmJs::Ceil_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_floor] = MathFunc(PropertyIds::floor, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_floor, OpCodeAsmJs::Floor_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_exp] = MathFunc(PropertyIds::exp, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_exp, OpCodeAsmJs::Exp_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_log] = MathFunc(PropertyIds::log, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_log, OpCodeAsmJs::Log_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_pow] = MathFunc(PropertyIds::pow, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 2, AsmJSMathBuiltin_pow, OpCodeAsmJs::Pow_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_sqrt] = MathFunc(PropertyIds::sqrt, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_sqrt, OpCodeAsmJs::Sqrt_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_abs] = MathFunc(PropertyIds::abs, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_abs, OpCodeAsmJs::Abs_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_atan2] = MathFunc(PropertyIds::atan2, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 2, AsmJSMathBuiltin_atan2, OpCodeAsmJs::Atan2_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_imul] = MathFunc(PropertyIds::imul, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 2, AsmJSMathBuiltin_imul, OpCodeAsmJs::Imul_Int, AsmJsRetType::Signed, AsmJsType::Intish, AsmJsType::Intish));
        mathFunctions[AsmJSMathBuiltin_fround] = MathFunc(PropertyIds::fround, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_fround, OpCodeAsmJs::Fround_Flt, AsmJsRetType::Float, AsmJsType::Floatish));
        mathFunctions[AsmJSMathBuiltin_min] = MathFunc(PropertyIds::min, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 2, AsmJSMathBuiltin_min, OpCodeAsmJs::Min_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_max] = MathFunc(PropertyIds::max, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 2, AsmJSMathBuiltin_max, OpCodeAsmJs::Max_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_clz32] = MathFunc(PropertyIds::clz32, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_clz32, OpCodeAsmJs::Clz32_Int, AsmJsRetType::Fixnum, AsmJsType::Intish));

        mathFunctions[AsmJSMathBuiltin_abs].val->SetOverload(Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_abs, OpCodeAsmJs::Abs_Int, AsmJsRetType::Unsigned, AsmJsType::Signed));
        mathFunctions[AsmJSMathBuiltin_min].val->SetOverload(Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 2, AsmJSMathBuiltin_min, OpCodeAsmJs::Min_Int, AsmJsRetType::Signed, AsmJsType::Signed, AsmJsType::Signed));
        mathFunctions[AsmJSMathBuiltin_max].val->SetOverload(Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 2, AsmJSMathBuiltin_max, OpCodeAsmJs::Max_Int, AsmJsRetType::Signed, AsmJsType::Signed, AsmJsType::Signed));

        //Float Overloads
        mathFunctions[AsmJSMathBuiltin_fround].val->SetOverload(Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_fround, OpCodeAsmJs::Fround_Db, AsmJsRetType::Float, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_fround].val->SetOverload(Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_fround, OpCodeAsmJs::Fround_Int, AsmJsRetType::Float, AsmJsType::Int));// should we split this into signed and unsigned?
        mathFunctions[AsmJSMathBuiltin_abs].val->SetOverload(Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_abs, OpCodeAsmJs::Abs_Flt, AsmJsRetType::Floatish, AsmJsType::MaybeFloat));
        mathFunctions[AsmJSMathBuiltin_ceil].val->SetOverload(Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_ceil, OpCodeAsmJs::Ceil_Flt, AsmJsRetType::Floatish, AsmJsType::MaybeFloat));
        mathFunctions[AsmJSMathBuiltin_floor].val->SetOverload(Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_floor, OpCodeAsmJs::Floor_Flt, AsmJsRetType::Floatish, AsmJsType::MaybeFloat));
        mathFunctions[AsmJSMathBuiltin_sqrt].val->SetOverload(Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_sqrt, OpCodeAsmJs::Sqrt_Flt, AsmJsRetType::Floatish, AsmJsType::MaybeFloat));

        for (int i = 0; i < AsmJSMathBuiltinFunction_COUNT; i++)
        {
            if (!AddStandardLibraryMathName((PropertyId)mathFunctions[i].id, mathFunctions[i].val, mathFunctions[i].val->GetMathBuiltInFunction()))
            {
                return false;
            }
        }

        struct ConstMath
        {
            ConstMath(PropertyId id_, const double* val_, AsmJSMathBuiltinFunction mathLibConstName_) :
                id(id_), val(val_), mathLibConstName(mathLibConstName_) { }
            PropertyId id;
            AsmJSMathBuiltinFunction mathLibConstName;
            const double* val;
        };
        ConstMath constMath[] = {
            ConstMath(PropertyIds::E       , &Math::E                           , AsmJSMathBuiltinFunction::AsmJSMathBuiltin_e),
            ConstMath(PropertyIds::LN10     , &Math::LN10                        , AsmJSMathBuiltinFunction::AsmJSMathBuiltin_ln10),
            ConstMath(PropertyIds::LN2      , &Math::LN2                         , AsmJSMathBuiltinFunction::AsmJSMathBuiltin_ln2),
            ConstMath(PropertyIds::LOG2E    , &Math::LOG2E                       , AsmJSMathBuiltinFunction::AsmJSMathBuiltin_log2e),
            ConstMath(PropertyIds::LOG10E   , &Math::LOG10E                      , AsmJSMathBuiltinFunction::AsmJSMathBuiltin_log10e),
            ConstMath(PropertyIds::PI       , &Math::PI                          , AsmJSMathBuiltinFunction::AsmJSMathBuiltin_pi),
            ConstMath(PropertyIds::SQRT1_2  , &Math::SQRT1_2                     , AsmJSMathBuiltinFunction::AsmJSMathBuiltin_sqrt1_2),
            ConstMath(PropertyIds::SQRT2    , &Math::SQRT2                       , AsmJSMathBuiltinFunction::AsmJSMathBuiltin_sqrt2),
            ConstMath(PropertyIds::Infinity , &NumberConstants::POSITIVE_INFINITY, AsmJSMathBuiltinFunction::AsmJSMathBuiltin_infinity),
            ConstMath(PropertyIds::NaN      , &NumberConstants::NaN              , AsmJSMathBuiltinFunction::AsmJSMathBuiltin_nan),
        };
        const int size = sizeof(constMath) / sizeof(ConstMath);
        for (int i = 0; i < size; i++)
        {
            if (!AddStandardLibraryMathName(constMath[i].id, constMath[i].val, constMath[i].mathLibConstName))
            {
                return false;
            }
        }


        struct ArrayFunc
        {
            ArrayFunc(PropertyId id_ = 0, AsmJsTypedArrayFunction* val_ = nullptr) :
                id(id_), val(val_)
            {
            }
            PropertyId id;
            AsmJsTypedArrayFunction* val;
        };

        ArrayFunc arrayFunctions[AsmJSMathBuiltinFunction_COUNT];
        arrayFunctions[AsmJSTypedArrayBuiltin_Int8Array] = ArrayFunc(PropertyIds::Int8Array, Anew(&mAllocator, AsmJsTypedArrayFunction, nullptr, &mAllocator, AsmJSTypedArrayBuiltin_Int8Array, ArrayBufferView::TYPE_INT8));
        arrayFunctions[AsmJSTypedArrayBuiltin_Uint8Array] = ArrayFunc(PropertyIds::Uint8Array, Anew(&mAllocator, AsmJsTypedArrayFunction, nullptr, &mAllocator, AsmJSTypedArrayBuiltin_Uint8Array, ArrayBufferView::TYPE_UINT8));
        arrayFunctions[AsmJSTypedArrayBuiltin_Int16Array] = ArrayFunc(PropertyIds::Int16Array, Anew(&mAllocator, AsmJsTypedArrayFunction, nullptr, &mAllocator, AsmJSTypedArrayBuiltin_Int16Array, ArrayBufferView::TYPE_INT16));
        arrayFunctions[AsmJSTypedArrayBuiltin_Uint16Array] = ArrayFunc(PropertyIds::Uint16Array, Anew(&mAllocator, AsmJsTypedArrayFunction, nullptr, &mAllocator, AsmJSTypedArrayBuiltin_Uint16Array, ArrayBufferView::TYPE_UINT16));
        arrayFunctions[AsmJSTypedArrayBuiltin_Int32Array] = ArrayFunc(PropertyIds::Int32Array, Anew(&mAllocator, AsmJsTypedArrayFunction, nullptr, &mAllocator, AsmJSTypedArrayBuiltin_Int32Array, ArrayBufferView::TYPE_INT32));
        arrayFunctions[AsmJSTypedArrayBuiltin_Uint32Array] = ArrayFunc(PropertyIds::Uint32Array, Anew(&mAllocator, AsmJsTypedArrayFunction, nullptr, &mAllocator, AsmJSTypedArrayBuiltin_Uint32Array, ArrayBufferView::TYPE_UINT32));
        arrayFunctions[AsmJSTypedArrayBuiltin_Float32Array] = ArrayFunc(PropertyIds::Float32Array, Anew(&mAllocator, AsmJsTypedArrayFunction, nullptr, &mAllocator, AsmJSTypedArrayBuiltin_Float32Array, ArrayBufferView::TYPE_FLOAT32));
        arrayFunctions[AsmJSTypedArrayBuiltin_Float64Array] = ArrayFunc(PropertyIds::Float64Array, Anew(&mAllocator, AsmJsTypedArrayFunction, nullptr, &mAllocator, AsmJSTypedArrayBuiltin_Float64Array, ArrayBufferView::TYPE_FLOAT64));

        for (int i = 0; i < AsmJSTypedArrayBuiltin_COUNT; i++)
        {
            if (!AddStandardLibraryArrayName((PropertyId)arrayFunctions[i].id, arrayFunctions[i].val, arrayFunctions[i].val->GetArrayBuiltInFunction()))
            {
                return false;
            }
        }
        return true;
    }